

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O1

void MoveIn(Heap *heap,Chuck *chuck)

{
  ChuckLayout *pCVar1;
  byte bVar2;
  Chuck *pCVar3;
  Chuck *pCVar4;
  Heap *pHVar5;
  Chuck **ppCVar6;
  Size size;
  
  if (heap->head == (Chuck *)0x0) {
    chuck->prev = (ChuckLayout *)0x0;
    chuck->next = (ChuckLayout *)0x0;
  }
  else {
    pCVar3 = FindSmallestFitInHeap(heap,(ulong)(*(uint *)&chuck->field_0x4 & 0xfffffffe) << 2);
    if (pCVar3 == (Chuck *)0x0) {
      pCVar3 = heap->last;
    }
    do {
      pCVar4 = pCVar3;
      if (*(uint *)&chuck->field_0x4 >> 1 < *(uint *)&pCVar4->field_0x4 >> 1) {
        pCVar1 = pCVar4->prev;
        chuck->prev = pCVar1;
        if (pCVar1 != (ChuckLayout *)0x0) {
          pCVar1->next = chuck;
        }
        chuck->next = pCVar4;
        if (pCVar4 != (Chuck *)0x0) {
          pCVar4->prev = chuck;
        }
        goto LAB_00102666;
      }
      pCVar3 = pCVar4->next;
    } while (pCVar4->next != (ChuckLayout *)0x0);
    chuck->prev = pCVar4;
    if (pCVar4 != (Chuck *)0x0) {
      pCVar4->next = chuck;
    }
    chuck->next = (ChuckLayout *)0x0;
  }
LAB_00102666:
  if (heap->head == (Chuck *)0x0) {
    if (heap->last != (Chuck *)0x0) {
      __assert_fail("!heap->last",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                    ,0xf5,"void MoveIn(Heap *, Chuck *)");
    }
    heap->last = chuck;
    pHVar5 = heap;
  }
  else {
    if (heap->head->prev == chuck) {
      heap->head = chuck;
    }
    if (heap->last->next != chuck) goto LAB_00102698;
    pHVar5 = (Heap *)&heap->last;
  }
  pHVar5->head = chuck;
LAB_00102698:
  size = (ulong)(*(uint *)&chuck->field_0x4 & 0xfffffffe) << 2;
  if (*(uint *)&chuck->field_0x4 < 0x86) {
    bVar2 = MatchExact(size);
    if (heap->exact[bVar2] != (Chuck *)0x0) {
      return;
    }
    ppCVar6 = heap->exact + bVar2;
  }
  else {
    bVar2 = MatchSorted(size);
    ppCVar6 = heap->sorted + bVar2;
    if ((*ppCVar6 != (Chuck *)0x0) &&
       (*(uint *)&(*ppCVar6)->field_0x4 >> 1 <= *(uint *)&chuck->field_0x4 >> 1)) {
      return;
    }
  }
  *ppCVar6 = chuck;
  return;
}

Assistant:

static void MoveIn(Heap *heap, Chuck *chuck) {
    if (heap->head) {
        Chuck *fit = FindSmallestFitInHeap(heap, GetSize(chuck));
        Insert(fit ? fit : heap->last, chuck);
    } else {
        SetPrev(chuck, NULL);
        SetNext(chuck, NULL);
    }

    if (!heap->head) {
        assert(!heap->last);
        heap->head = heap->last = chuck;
    } else {
        if (chuck == heap->head->prev) {
            heap->head = chuck;
        }
        if (chuck == heap->last->next) {
            heap->last = chuck;
        }
    }

    if (GetSize(chuck) < NOT_EXACT_MIN) {
        uint8_t slot = MatchExact(GetSize(chuck));
        if (!heap->exact[slot]) {
            heap->exact[slot] = chuck;
        }
    } else {
        uint8_t slot = MatchSorted(GetSize(chuck));
        if (!heap->sorted[slot] ||
            GetSize(chuck) < GetSize(heap->sorted[slot])) {
            heap->sorted[slot] = chuck;
        }
    }
}